

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShape.cpp
# Opt level: O1

ChColor __thiscall chrono::ChVisualShape::GetColor(ChVisualShape *this)

{
  uint uVar1;
  long lVar2;
  long in_RSI;
  ulong in_XMM0_Qa;
  float in_XMM1_Da;
  ChColor CVar3;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  this->_vptr_ChVisualShape = (_func_int **)0x3f8000003f800000;
  this->visible = false;
  this->is_mutable = false;
  *(undefined2 *)&this->field_0xa = 0x3f80;
  if (*(long **)(in_RSI + 0x10) == *(long **)(in_RSI + 0x18)) {
    ChVisualMaterial::Default();
    if ((ChVisualShape *)(local_20 + 0xc) != this) {
      *(undefined4 *)&this->_vptr_ChVisualShape = *(undefined4 *)(local_20 + 0xc);
      *(undefined4 *)((long)&this->_vptr_ChVisualShape + 4) = *(undefined4 *)(local_20 + 0x10);
      uVar1 = *(uint *)(local_20 + 0x14);
      in_XMM0_Qa = (ulong)uVar1;
      this->visible = (bool)(char)uVar1;
      this->is_mutable = (bool)(char)(uVar1 >> 8);
      *(short *)&this->field_0xa = (short)(uVar1 >> 0x10);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  else {
    lVar2 = **(long **)(in_RSI + 0x10);
    if ((ChVisualShape *)(lVar2 + 0xc) != this) {
      *(undefined4 *)&this->_vptr_ChVisualShape = *(undefined4 *)(lVar2 + 0xc);
      *(undefined4 *)((long)&this->_vptr_ChVisualShape + 4) = *(undefined4 *)(lVar2 + 0x10);
      uVar1 = *(uint *)(lVar2 + 0x14);
      in_XMM0_Qa = (ulong)uVar1;
      this->visible = (bool)(char)uVar1;
      this->is_mutable = (bool)(char)(uVar1 >> 8);
      *(short *)&this->field_0xa = (short)(uVar1 >> 0x10);
    }
  }
  CVar3.B = in_XMM1_Da;
  CVar3.R = (float)(int)in_XMM0_Qa;
  CVar3.G = (float)(int)(in_XMM0_Qa >> 0x20);
  return CVar3;
}

Assistant:

ChColor ChVisualShape::GetColor() const {
    ChColor RGB;
    if (material_list.empty()) {
        RGB = ChVisualMaterial::Default()->GetDiffuseColor();
    } else {
        RGB = material_list[0]->GetDiffuseColor();
    }

    return RGB;
}